

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId
          (uint edge_id,ON_SubDEdgeTag etag,ON_SubDEdgeSharpness sharpness)

{
  ON_SubDEdgeTag OVar1;
  bool bVar2;
  float fStack_20;
  ON_SubDEdgeTag etag_local;
  uint edge_id_local;
  ON_SubDEdgeSharpness sharpness_local;
  ON_SubD_ComponentIdTypeAndTag itt;
  
  _fStack_20 = sharpness.m_edge_sharpness;
  _sharpness_local = CreateFromEdgeId(edge_id,etag);
  if ((itt.m_sharpness.m_edge_sharpness[1]._0_1_ == Edge) &&
     (((OVar1 = EdgeTag((ON_SubD_ComponentIdTypeAndTag *)&sharpness_local), OVar1 == Smooth ||
       (OVar1 == SmoothX)) &&
      (bVar2 = ON_SubDEdgeSharpness::IsSharp((ON_SubDEdgeSharpness *)&stack0xffffffffffffffe0),
      bVar2)))) {
    sharpness_local.m_edge_sharpness[0] = fStack_20;
    sharpness_local.m_edge_sharpness[1] = (float)edge_id_local;
  }
  return _sharpness_local;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag, ON_SubDEdgeSharpness sharpness)
{
  ON_SubD_ComponentIdTypeAndTag itt = CreateFromEdgeId(edge_id, etag);
  if (ON_SubDComponentPtr::Type::Edge == itt.m_type)
  {
    switch (itt.EdgeTag())
    {
    case ON_SubDEdgeTag::Smooth:
    case ON_SubDEdgeTag::SmoothX:
      if (sharpness.IsSharp())
        itt.m_sharpness = sharpness;
      break;
    default:
      break;
    }
  }
  return itt;
}